

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric::GetMainInertiasInMassReference
          (ChBeamSectionTimoshenkoAdvancedGeneric *this,double *Jmyy,double *Jmzz,double *Jmyz,
          double *mass_phi,double *Qmy,double *Qmz)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  EigenMat5x5 Acl2cog;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  undefined1 extraout_var [56];
  
  dVar15 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.Mz;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar15;
  dVar16 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.mu;
  dVar26 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.My;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar26;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar16 * dVar15;
  auVar31 = vfnmadd213sd_fma(auVar31,auVar22,auVar20);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar26 * dVar16;
  auVar6 = vfnmadd213sd_fma(auVar34,auVar27,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz;
  auVar20 = vfmsub213sd_fma(auVar27,auVar22,auVar7);
  dVar15 = (auVar31._0_8_ - auVar6._0_8_) * 0.5;
  dVar26 = auVar20._0_8_;
  dVar15 = dVar26 * dVar26 + dVar15 * dVar15;
  dVar16 = 0.0;
  if (0.0 < dVar15) {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar15;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      auVar20 = vsqrtsd_avx(auVar23,auVar23);
      dVar15 = auVar20._0_8_;
    }
    dVar16 = atan2(dVar26 / dVar15,(auVar6._0_8_ - auVar31._0_8_) / (dVar15 + dVar15));
    dVar16 = dVar16 * -0.5;
  }
  *mass_phi = dVar16;
  dVar15 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.Mz;
  dVar26 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.mu;
  dVar1 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .My;
  dVar8 = dVar26 * dVar15;
  dVar26 = dVar26 * dVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar26;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar8;
  auVar6 = vunpcklpd_avx(auVar35,auVar28);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 * dVar26;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar15 * dVar8;
  auVar7 = vunpcklpd_avx(auVar36,auVar32);
  dVar17 = cos(dVar16);
  dVar18 = sin(*mass_phi);
  dVar19 = cos(*mass_phi + *mass_phi);
  auVar21._0_8_ = sin(*mass_phi + *mass_phi);
  auVar21._8_56_ = extraout_var;
  dVar8 = dVar17 * dVar17;
  dVar9 = dVar18 * dVar18;
  auVar37._0_8_ = -dVar18;
  auVar37._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
  uVar2 = vmovlpd_avx(auVar37);
  dVar16 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.My;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar16;
  dVar1 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .Mz;
  auVar20 = auVar21._0_16_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar8 * dVar1 * -2.0;
  auVar22 = vfmadd231sd_fma(auVar43,auVar38,auVar20);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar9;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar16 * -2.0;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar21._0_8_ * dVar1;
  auVar27 = vfmadd231sd_fma(auVar44,auVar39,auVar29);
  auVar45._0_8_ = -auVar21._0_8_;
  auVar45._8_8_ = extraout_var._0_8_ ^ 0x8000000000000000;
  uVar3 = vmovlpd_avx(auVar45);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar9 * dVar1 * -2.0;
  auVar23 = vfnmadd231sd_fma(auVar41,auVar38,auVar20);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar8;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar21._0_8_ * -dVar1;
  auVar31 = vfmadd213sd_fma(auVar39,auVar24,auVar33);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar19;
  auVar24 = vfnmadd231sd_fma(auVar33,auVar38,auVar30);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar19 * dVar1;
  auVar34 = vfmsub231sd_fma(auVar25,auVar20,auVar38);
  auVar4._0_8_ = this->Qy;
  auVar4._8_8_ = this->Qz;
  auVar20 = vmovhpd_avx(auVar4,this->Qz);
  auVar6 = vsubpd_avx(auVar20,auVar6);
  auVar5._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy;
  auVar5._8_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz;
  auVar20 = vmovhpd_avx(auVar5,(this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz);
  auVar20 = vsubpd_avx(auVar20,auVar7);
  dVar16 = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz - dVar15 * dVar26;
  local_70 = auVar6._0_8_;
  auVar40._0_8_ = local_70 * dVar17;
  auVar40._8_8_ = local_70 * dVar18;
  dStack_68 = auVar6._8_8_;
  auVar42._8_8_ = dStack_68;
  auVar42._0_8_ = dStack_68;
  auVar10._8_8_ = dVar17;
  auVar10._0_8_ = uVar2;
  auVar6 = vfmadd231pd_fma(auVar40,auVar42,auVar10);
  local_60 = auVar20._0_8_;
  auVar46._8_8_ = local_60;
  auVar46._0_8_ = local_60;
  auVar6 = vfmadd231pd_fma(auVar6,auVar46,ZEXT816(0));
  dStack_58 = auVar20._8_8_;
  auVar47._8_8_ = dStack_58;
  auVar47._0_8_ = dStack_58;
  auVar20 = vfmadd231pd_fma(auVar6,auVar47,ZEXT816(0));
  auVar48._8_8_ = dVar16;
  auVar48._0_8_ = dVar16;
  auVar20 = vfmadd231pd_fma(auVar20,auVar48,ZEXT816(0));
  auVar49._0_8_ = local_70 * auVar22._0_8_;
  auVar49._8_8_ = local_70 * auVar23._0_8_;
  auVar11._8_8_ = auVar31._0_8_;
  auVar11._0_8_ = auVar27._0_8_;
  auVar6 = vfmadd231pd_fma(auVar49,auVar42,auVar11);
  auVar12._8_8_ = dVar9;
  auVar12._0_8_ = dVar8;
  auVar6 = vfmadd231pd_fma(auVar6,auVar46,auVar12);
  auVar13._8_8_ = dVar8;
  auVar13._0_8_ = dVar9;
  auVar6 = vfmadd231pd_fma(auVar6,auVar47,auVar13);
  auVar14._8_8_ = auVar21._0_8_;
  auVar14._0_8_ = uVar3;
  auVar6 = vfmadd231pd_fma(auVar6,auVar48,auVar14);
  dVar15 = (double)vmovlpd_avx(auVar20);
  *Qmy = dVar15;
  dVar15 = (double)vmovhpd_avx(auVar20);
  *Qmz = dVar15;
  dVar15 = (double)vmovlpd_avx(auVar6);
  *Jmyy = dVar15;
  dVar15 = (double)vmovhpd_avx(auVar6);
  *Jmzz = dVar15;
  *Jmyz = auVar24._0_8_ * local_70 + dStack_68 * auVar34._0_8_ +
          local_60 * auVar21._0_8_ * 0.5 + dStack_58 * auVar21._0_8_ * -0.5 + dVar19 * dVar16;
  return;
}

Assistant:

void ChBeamSectionTimoshenkoAdvancedGeneric::GetMainInertiasInMassReference(double& Jmyy,
                                                                            double& Jmzz,
                                                                            double& Jmyz,
                                                                            double& mass_phi,
                                                                            double& Qmy,
                                                                            double& Qmz) {
    // inherit the algorithm from Rayleigh beam class, ignoring Qy,Qz to solve the mass_phi approximately.
    // remove inertia transport
    double Tyy_rot = this->Jyy - this->mu * this->Mz * this->Mz;
    double Tzz_rot = this->Jzz - this->mu * this->My * this->My;
    double Tyz_rot = -this->Jyz + this->mu * this->Mz * this->My;
    // tensor de-rotation up to principal axes
    double argum = pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2);
    if (argum <= 0) {
        mass_phi = 0;
        // Jmyy = 0.5 * (Tzz_rot + Tyy_rot);
        // Jmzz = 0.5 * (Tzz_rot + Tyy_rot);
        // return;
    } else {
        double discr = sqrt(pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2));
        mass_phi = -0.5 * atan2(Tyz_rot / discr, (Tzz_rot - Tyy_rot) / (2. * discr));
        // Jmyy = 0.5 * (Tzz_rot + Tyy_rot) - discr;
        // Jmzz = 0.5 * (Tzz_rot + Tyy_rot) + discr;
    }

    // a constant vector, which is from the mass center offset (My,Mz)
    EigenMat5x1 const_vec;
    const_vec.setZero();
    const_vec(0) = this->mu * this->Mz;
    const_vec(1) = this->mu * this->My;
    const_vec(2) = this->mu * this->Mz * this->Mz;
    const_vec(3) = this->mu * this->My * this->My;
    const_vec(4) = this->mu * this->My * this->Mz;

    // transformation matrix from the centerline of beam to the mass center coordinate system
    EigenMat5x5 Acl2cog;
    Acl2cog.setZero();
    double cosphi = cos(mass_phi);
    double sinphi = sin(mass_phi);
    double cos2phi = cos(2. * mass_phi);
    double sin2phi = sin(2. * mass_phi);
    double cosphi2 = cosphi * cosphi;
    double sinphi2 = sinphi * sinphi;

    Acl2cog(0, 0) = cosphi;
    Acl2cog(0, 1) = -sinphi;

    Acl2cog(1, 0) = sinphi;
    Acl2cog(1, 1) = cosphi;

    Acl2cog(2, 0) = this->My * sin2phi - 2. * this->Mz * cosphi2;
    Acl2cog(2, 1) = -2. * this->My * sinphi2 + this->Mz * sin2phi;
    Acl2cog(2, 2) = cosphi2;
    Acl2cog(2, 3) = sinphi2;
    Acl2cog(2, 4) = -sin2phi;

    Acl2cog(3, 0) = -this->My * sin2phi - 2. * this->Mz * sinphi2;
    Acl2cog(3, 1) = -2. * this->My * cosphi2 - this->Mz * sin2phi;
    Acl2cog(3, 2) = sinphi2;
    Acl2cog(3, 3) = cosphi2;
    Acl2cog(3, 4) = sin2phi;

    Acl2cog(4, 0) = -this->My * cos2phi - this->Mz * sin2phi;
    Acl2cog(4, 1) = this->My * sin2phi - this->Mz * cos2phi;
    Acl2cog(4, 2) = 1. / 2. * sin2phi;
    Acl2cog(4, 3) = -1. / 2. * sin2phi;
    Acl2cog(4, 4) = cos2phi;

    // a vector of mass properties expressed in the centerline of beam
    EigenMat5x1 J_vec;
    J_vec.setZero();

    J_vec(0) = this->Qy;
    J_vec(1) = this->Qz;
    J_vec(2) = this->Jyy;
    J_vec(3) = this->Jzz;
    J_vec(4) = this->Jyz;

    // define a vector of local mass properties expressed in mass center coordinate system
    EigenMat5x1 Jm_vec;
    Jm_vec.setZero();
    Jm_vec = Acl2cog * (J_vec - const_vec);

    Qmy = Jm_vec(0);
    Qmz = Jm_vec(1);
    Jmyy = Jm_vec(2);
    Jmzz = Jm_vec(3);
    Jmyz = Jm_vec(4);
}